

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

bool TestHashList<Blob<224>>
               (vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  long lVar8;
  size_t i;
  ulong uVar9;
  double dVar10;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> revhashes;
  HashSet<Blob<224>_> collisions;
  Blob<224> local_68;
  Blob<224> local_4c;
  
  bVar1 = true;
  if ((int)CONCAT71(in_register_00000011,testCollision) != 0) {
    dVar10 = EstimateNbCollisions
                       ((int)(((long)(hashes->
                                     super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(hashes->
                                    super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                                    _M_impl.super__Vector_impl_data._M_start) / 0x1c),0xe0);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",0xe0);
    collisions.super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_left =
         &collisions.super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>._M_t.
          _M_impl.super__Rb_tree_header._M_header;
    collisions.super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_color = _S_red;
    collisions.super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    collisions.super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>._M_t._M_impl
    .super__Rb_tree_header._M_node_count = 0;
    collisions.super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_right =
         collisions.super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>._M_t.
         _M_impl.super__Rb_tree_header._M_header._M_left;
    uVar7 = FindCollisions<Blob<224>>(hashes,&collisions,1000);
    printf("actual %6i (%.2fx)",(double)(int)uVar7 / dVar10,(ulong)uVar7);
    bVar1 = (int)uVar7 < 1;
    if (!bVar1) {
      printf(" !!!!!");
    }
    putchar(10);
    fflush((FILE *)0x0);
    if (testHighBits) {
      bVar1 = CountHighbitsCollisions<Blob<224>>(hashes,0xa0);
      bVar2 = CountHighbitsCollisions<Blob<224>>(hashes,0x80);
      bVar3 = CountHighbitsCollisions<Blob<224>>(hashes,0x40);
      bVar4 = CountHighbitsCollisions<Blob<224>>(hashes,0x20);
      bVar5 = TestHighbitsCollisions<Blob<224>>(hashes);
      bVar1 = (((bVar3 && bVar4) && (bVar1 && bVar2)) && bVar5) && (int)uVar7 < 1;
    }
    if (testLowBits) {
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector(&revhashes,hashes);
      lVar8 = 0;
      uVar9 = 0;
      while( true ) {
        if ((ulong)(((long)revhashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)revhashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x1c) <= uVar9) break;
        Blob<224>::Blob(&local_68,
                        (Blob<224> *)
                        (((hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                          _M_impl.super__Vector_impl_data._M_start)->bytes + lVar8));
        bitreverse<Blob<224>>(&local_4c,&local_68,0xe0);
        Blob<224>::operator=
                  ((Blob<224> *)
                   ((revhashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                     super__Vector_impl_data._M_start)->bytes + lVar8),&local_4c);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x1c;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (revhashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 revhashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 ((long)revhashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)revhashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                       super__Vector_impl_data._M_start) % 0x1c);
      bVar2 = CountLowbitsCollisions<Blob<224>>(&revhashes,0xa0);
      bVar3 = CountLowbitsCollisions<Blob<224>>(&revhashes,0x80);
      bVar4 = CountLowbitsCollisions<Blob<224>>(&revhashes,0x40);
      bVar5 = CountLowbitsCollisions<Blob<224>>(&revhashes,0x20);
      bVar6 = TestLowbitsCollisions<Blob<224>>(&revhashes);
      bVar1 = (bool)((bVar5 && bVar6) & (bVar3 && bVar4) & bVar1 & bVar2);
      std::_Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>::~_Vector_base
                (&revhashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>);
    }
    std::
    _Rb_tree<Blob<224>,_Blob<224>,_std::_Identity<Blob<224>_>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>
    ::~_Rb_tree((_Rb_tree<Blob<224>,_Blob<224>,_std::_Identity<Blob<224>_>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>
                 *)&collisions);
  }
  if (testDist) {
    bVar2 = TestDistribution<Blob<224>>(hashes,drawDiagram);
    bVar1 = bVar1 != false && bVar2;
  }
  return bVar1;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if (testCollision)
  {
    size_t const count = hashes.size();
    double const expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if ((collcount / expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");
    fflush(NULL);

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 224);
      result &= CountHighbitsCollisions(hashes, 160);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);

      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountHighbitsCollisions(hashes,   12);
      //result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(hashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 224);
      result &= CountLowbitsCollisions(revhashes, 160);
      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountLowbitsCollisions(revhashes,   12);
      //result &= CountLowbitsCollisions(revhashes,   8);

      //std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}